

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

QString * QMakeEvaluator::formatValueList
                    (QString *__return_storage_ptr__,ProStringList *vals,bool commas)

{
  long lVar1;
  ProString *str;
  ProString *val;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (vals->super_QList<ProString>).d.size;
  if (lVar1 != 0) {
    val = (vals->super_QList<ProString>).d.ptr;
    lVar1 = lVar1 * 0x30;
    do {
      if ((__return_storage_ptr__->d).size != 0) {
        if (commas) {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        QString::append((QChar)(char16_t)__return_storage_ptr__);
      }
      formatValue(&local_48,val,false);
      QString::append((QString *)__return_storage_ptr__);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      val = val + 1;
      lVar1 = lVar1 + -0x30;
    } while (lVar1 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeEvaluator::formatValueList(const ProStringList &vals, bool commas)
{
    QString ret;

    for (const ProString &str : vals) {
        if (!ret.isEmpty()) {
            if (commas)
                ret += QLatin1Char(',');
            ret += QLatin1Char(' ');
        }
        ret += formatValue(str);
    }
    return ret;
}